

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::CmdLine::initialize(void)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  ::(anonymous_namespace)::desc_ = (long *)operator_new(0x98);
  *::(anonymous_namespace)::desc_ = (long)(::(anonymous_namespace)::desc_ + 2);
  ::(anonymous_namespace)::desc_[1] = 0;
  *(undefined1 *)(::(anonymous_namespace)::desc_ + 2) = 0;
  *(undefined4 *)(::(anonymous_namespace)::desc_ + 5) = 0;
  ::(anonymous_namespace)::desc_[6] = 0;
  ::(anonymous_namespace)::desc_[7] = (long)(::(anonymous_namespace)::desc_ + 5);
  ::(anonymous_namespace)::desc_[8] = (long)(::(anonymous_namespace)::desc_ + 5);
  ::(anonymous_namespace)::desc_[9] = 0;
  *(undefined4 *)(::(anonymous_namespace)::desc_ + 0xb) = 0;
  ::(anonymous_namespace)::desc_[0xc] = 0;
  ::(anonymous_namespace)::desc_[0xd] = (long)(::(anonymous_namespace)::desc_ + 0xb);
  ::(anonymous_namespace)::desc_[0xe] = (long)(::(anonymous_namespace)::desc_ + 0xb);
  ::(anonymous_namespace)::desc_[0xf] = 0;
  ::(anonymous_namespace)::desc_[0x10] = 0;
  ::(anonymous_namespace)::desc_[0x11] = 0;
  ::(anonymous_namespace)::desc_[0x12] = 0;
  std::__cxx11::string::string((string *)&local_28,"global",&local_49);
  std::__cxx11::string::string((string *)&local_48,"",&local_4a);
  declare_arg_group(&local_28,&local_48,ARG_FLAGS_DEFAULT);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void initialize() {
            desc_ = new CommandLineDesc;
            declare_arg_group("global", "");
        }